

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall CVmImagePool::~CVmImagePool(CVmImagePool *this)

{
  size_t sVar1;
  CVmImagePool *in_RDI;
  size_t cnt;
  size_t i;
  ulong local_10;
  
  (in_RDI->super_CVmPoolBackingStore)._vptr_CVmPoolBackingStore =
       (_func_int **)&PTR__CVmImagePool_004462a0;
  if (in_RDI->page_info_ != (CVmImagePool_pg **)0x0) {
    sVar1 = get_subarray_count(in_RDI);
    for (local_10 = 0; local_10 < sVar1; local_10 = local_10 + 1) {
      free(in_RDI->page_info_[local_10]);
    }
    free(in_RDI->page_info_);
  }
  CVmPoolBackingStore::~CVmPoolBackingStore(&in_RDI->super_CVmPoolBackingStore);
  return;
}

Assistant:

CVmImagePool::~CVmImagePool()
{
    /* if we allocated a set of page offset arrays, delete them */
    if (page_info_ != 0)
    {
        size_t i;
        size_t cnt;

        /* compute the number of subarrays we have */
        cnt = get_subarray_count();

        /* delete each subarray */
        for (i = 0 ; i < cnt ; ++i)
            t3free(page_info_[i]);

        /* delete the master array */
        t3free(page_info_);
    }
}